

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tunings.h
# Opt level: O0

void __thiscall Tunings::Scale::Scale(Scale *this)

{
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  Scale *local_10;
  Scale *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"empty scale",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->description,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->rawText,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  this->count = 0;
  std::vector<Tunings::Tone,_std::allocator<Tunings::Tone>_>::vector(&this->tones);
  return;
}

Assistant:

Scale() : name("empty scale"), description(""), rawText(""), count(0) {}